

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O3

void __thiscall cmDepends::cmDepends(cmDepends *this,cmLocalGenerator *lg,char *targetDir)

{
  char *pcVar1;
  allocator local_21;
  
  this->_vptr_cmDepends = (_func_int **)&PTR__cmDepends_005b5d68;
  (this->CompileDirectory)._M_dataplus._M_p = (pointer)&(this->CompileDirectory).field_2;
  (this->CompileDirectory)._M_string_length = 0;
  (this->CompileDirectory).field_2._M_local_buf[0] = '\0';
  this->LocalGenerator = lg;
  this->Verbose = false;
  this->FileComparison = (cmFileTimeComparison *)0x0;
  (this->Language)._M_dataplus._M_p = (pointer)&(this->Language).field_2;
  (this->Language)._M_string_length = 0;
  (this->Language).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->TargetDirectory,targetDir,&local_21);
  this->MaxPath = 0x4000;
  pcVar1 = (char *)operator_new__(0x4000);
  this->Dependee = pcVar1;
  pcVar1 = (char *)operator_new__(0x4000);
  this->Depender = pcVar1;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmDepends::cmDepends(cmLocalGenerator* lg, const char* targetDir):
  CompileDirectory(),
  LocalGenerator(lg),
  Verbose(false),
  FileComparison(0),
  TargetDirectory(targetDir),
  MaxPath(16384),
  Dependee(new char[MaxPath]),
  Depender(new char[MaxPath])
{
}